

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.h
# Opt level: O2

bool __thiscall Sphere::intersect(Sphere *this,Ray *ray,Hit *h,float tmin)

{
  undefined8 uVar1;
  bool bVar2;
  long lVar3;
  float *pfVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  float __tmp;
  float fVar13;
  float s [2];
  Vector3f local_60;
  Vector3f local_54;
  Vector3f norm;
  Vector3f p;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  operator-(&ray->o,&this->o);
  auVar11._0_4_ = Vector3f::squaredLength(&p);
  auVar11._4_60_ = extraout_var;
  auVar6 = vfnmadd213ss_fma(ZEXT416((uint)this->r),ZEXT416((uint)this->r),auVar11._0_16_);
  fVar7 = Vector3f::dot(&p,&ray->d);
  auVar10 = ZEXT416((uint)(fVar7 + fVar7));
  fVar8 = Vector3f::squaredLength(&ray->d);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * -4.0 * auVar6._0_4_)),auVar10,auVar10);
  fVar9 = auVar6._0_4_;
  if (0.0 <= fVar9) {
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      auVar6 = vsqrtss_avx(auVar6,auVar6);
      fVar9 = auVar6._0_4_;
    }
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(auVar10,auVar6);
    fVar13 = (auVar6._0_4_ - fVar9) / (fVar8 + fVar8);
    s[1] = (fVar9 - (fVar7 + fVar7)) / (fVar8 + fVar8);
    s[0] = fVar13;
    if (s[1] < fVar13) {
      s[0] = s[1];
      s[1] = fVar13;
    }
    lVar3 = 0;
    do {
      bVar5 = lVar3 != 8;
      if (lVar3 == 8) {
        return bVar5;
      }
      fVar7 = *(float *)((long)s + lVar3);
      lVar3 = lVar3 + 4;
    } while ((fVar7 < tmin) || (h->t <= fVar7));
    ::operator*(&local_60,fVar7);
    operator+(&ray->o,&local_60);
    operator-(&local_54,&this->o);
    Vector3f::normalize(&norm);
    h->t = fVar7;
    h->obj = &this->super_Object;
    Vector3f::operator=(&h->norm,&norm);
    pfVar4 = Vector3f::operator[](&norm,2);
    fVar7 = *pfVar4;
    pfVar4 = Vector3f::operator[](&norm,0);
    auVar12._0_4_ = atan2f(fVar7,*pfVar4);
    auVar12._4_60_ = extraout_var_00;
    uVar1 = vcmpss_avx512f(auVar12._0_16_,ZEXT816(0) << 0x40,1);
    bVar2 = (bool)((byte)uVar1 & 1);
    pfVar4 = Vector3f::operator[](&norm,1);
    Vector2f::Vector2f((Vector2f *)&local_54,(1.0 - *pfVar4) * 0.5,
                       (float)((uint)bVar2 * (int)(auVar12._0_4_ + 6.2831855) +
                              (uint)!bVar2 * (int)auVar12._0_4_) / 6.2831855);
    Vector2f::operator=(&h->pos,(Vector2f *)&local_54);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool intersect(const Ray& ray, Hit& h, float tmin) override {
		Vector3f p = ray.o - o;
		float C = p.squaredLength() - r * r;
		float B = 2 * Vector3f::dot(p, ray.d);
		float A = ray.d.squaredLength();
		float dt = B * B - 4 * A * C;
		if (dt < 0) return 0;
		dt = sqrt(dt);
		float s[2] = { (-B - dt) / (2 * A),(-B + dt) / (2 * A) };
		if (s[0] > s[1]) std::swap(s[0], s[1]);
		for (float t : s)
		{
			if (t < tmin || t >= h.t) continue;
			Vector3f norm = ray.o + ray.d * t - o;
			norm.normalize();
			h.t = t; h.obj = this; h.norm = norm;
			float u = atan2f(norm[2], norm[0]);
			if (u < 0) u += PI * 2;
			h.pos = Vector2f((-norm[1] + 1) / 2, u / (PI * 2));
			return 1;
		}
		return 0;
	}